

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order6i
              (sunrealtype *b,sunrealtype *c1,sunrealtype **A1,sunrealtype **A2,sunrealtype *c2,
              sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *x;
  sunrealtype *b_00;
  ulong uVar2;
  size_t __nmemb;
  ulong uVar3;
  double dVar4;
  
  __nmemb = (size_t)s;
  x = (sunrealtype *)calloc(__nmemb,8);
  b_00 = (sunrealtype *)calloc(__nmemb,8);
  if ((((0 < (long)__nmemb) && (c2 != (sunrealtype *)0x0)) && (c3 != (sunrealtype *)0x0)) &&
     (x != (sunrealtype *)0x0)) {
    uVar3 = (ulong)(uint)s;
    uVar2 = 0;
    do {
      x[uVar2] = c2[uVar2] * c3[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    iVar1 = arkode_butcher_mv(A2,x,s,b_00);
    if (((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A1,b_00,s,x), iVar1 == 0)) &&
       (b_00 != (sunrealtype *)0x0 && c1 != (sunrealtype *)0x0)) {
      uVar2 = 0;
      do {
        b_00[uVar2] = c1[uVar2] * x[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      if (b == (sunrealtype *)0x0) {
        return 0;
      }
      dVar4 = 0.0;
      uVar2 = 0;
      do {
        dVar4 = dVar4 + b[uVar2] * b_00[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      free(x);
      free(b_00);
      return (uint)(ABS(dVar4 + -0.013888888888888888) <= 1.4901161193847656e-08);
    }
  }
  free(x);
  free(b_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6i(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype** A1, sunrealtype** A2,
                                             sunrealtype* c2, sunrealtype* c3,
                                             int s)
{
  sunrealtype bcAAcc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c2, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bcAAcc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bcAAcc - SUN_RCONST(1.0) / SUN_RCONST(72.0)) > TOL) ? SUNFALSE
                                                                      : SUNTRUE;
}